

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Raytracer::Image::~Image(Image *this)

{
  RGB **ppRVar1;
  int y;
  long lVar2;
  
  for (lVar2 = 0; ppRVar1 = this->datas, lVar2 < this->height; lVar2 = lVar2 + 1) {
    if (ppRVar1[lVar2] != (RGB *)0x0) {
      operator_delete__(ppRVar1[lVar2]);
    }
  }
  if (ppRVar1 != (RGB **)0x0) {
    operator_delete__(ppRVar1);
    return;
  }
  return;
}

Assistant:

Raytracer::Image::~Image() {
    for(int y = 0;y<height;y++){
        delete[] datas[y];
    }
    delete[] datas;
}